

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O2

void checkfile(char *inp,permonst *pm,boolean user_typed_name,boolean without_asking)

{
  nh_menuitem *pnVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  attack aVar6;
  boolean bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  dlb *dp;
  char *pcVar13;
  size_t sVar14;
  attack *paVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  undefined8 uVar19;
  bool bVar20;
  undefined7 in_register_00000011;
  long lVar21;
  char *text;
  char *text_00;
  char *text_01;
  char *text_02;
  char *text_03;
  uint uVar22;
  permonst *pm_00;
  ulong uVar23;
  byte bVar24;
  char *pcVar25;
  bool bVar26;
  bool bVar27;
  long lStack_9a0;
  menulist menu;
  char *local_968;
  long txt_offset;
  uint local_958;
  uint local_954;
  undefined4 local_950;
  int entry_count;
  char buf_1 [256];
  long entry_offset;
  char size [256];
  char buf [256];
  char newstr [256];
  char adjbuf [256];
  char local_438 [256];
  char specialadj [256];
  char local_238 [256];
  char mnname [256];
  
  cVar8 = (char)pm;
  dp = dlb_fopen("data","r");
  if (dp == (dlb *)0x0) {
    pline("Cannot open data file!");
    return;
  }
  if (cVar8 != '\0') {
    pline("Looking up \"%s\"...",inp);
  }
  strcpy(newstr,inp);
  lcase(newstr);
  iVar9 = bcmp(newstr,"interior of ",0xc);
  lVar21 = 0;
  if (iVar9 == 0) {
    lVar21 = 0xc;
  }
  local_950 = (undefined4)CONCAT71(in_register_00000011,user_typed_name);
  if (newstr[lVar21] == 'a') {
    lVar18 = 1;
    if (iVar9 == 0) {
      lVar18 = 0xd;
    }
    if (newstr[lVar18] != ' ') {
      lVar18 = 1;
      if (iVar9 == 0) {
        lVar18 = 0xd;
      }
      if (newstr[lVar18] == 'n') {
        lVar18 = 2;
        if (iVar9 == 0) {
          lVar18 = 0xe;
        }
        if (newstr[lVar18] == ' ') {
          lVar21 = 3;
          if (iVar9 == 0) {
            lVar21 = 0xf;
          }
          goto LAB_0020168d;
        }
      }
      goto LAB_002016ea;
    }
    lVar21 = 2;
    if (iVar9 == 0) {
      lVar21 = 0xe;
    }
LAB_0020168d:
    pcVar13 = newstr + lVar21;
  }
  else {
LAB_002016ea:
    iVar10 = strncmp(newstr + lVar21,"the ",4);
    pcVar13 = newstr + 4;
    if (iVar9 == 0) {
      pcVar13 = newstr + 0x10;
    }
    if (iVar10 != 0) {
      pcVar13 = newstr + lVar21;
    }
  }
  lVar21 = 5;
  iVar9 = strncmp(pcVar13,"tame ",5);
  if (iVar9 != 0) {
    iVar9 = strncmp(pcVar13,"peaceful ",9);
    lVar21 = (ulong)(iVar9 == 0) * 9;
  }
  pcVar25 = pcVar13 + lVar21;
  iVar9 = strncmp(pcVar25,"invisible ",10);
  local_968 = pcVar13 + lVar21 + 10;
  if (iVar9 != 0) {
    local_968 = pcVar25;
  }
  iVar10 = strncmp(local_968,"statue of ",10);
  if (iVar10 == 0) {
    lVar21 = 0x10;
    lStack_9a0 = 6;
LAB_002017bd:
    if (iVar9 == 0) {
      lStack_9a0 = lVar21;
    }
    pcVar25[lStack_9a0] = '\0';
  }
  else {
    iVar10 = strncmp(local_968,"figurine of ",0xc);
    if (iVar10 == 0) {
      lVar21 = 0x12;
      lStack_9a0 = 8;
      goto LAB_002017bd;
    }
  }
  if (*local_968 != '\0') {
    pcVar13 = strstri(local_968," [seen");
    if ((pcVar13 != (char *)0x0) ||
       (pcVar13 = strstri(local_968," and more"), pcVar13 != (char *)0x0)) {
      *pcVar13 = '\0';
    }
    pcVar13 = strstri(local_968," named ");
    if (pcVar13 == (char *)0x0) {
      pcVar13 = strstri(local_968," called ");
      if (pcVar13 == (char *)0x0) {
        pcVar13 = strstri(local_968,", ");
      }
      pcVar25 = (char *)0x0;
    }
    else {
      pcVar25 = pcVar13 + 7;
    }
    if (local_968 < pcVar13) {
      *pcVar13 = '\0';
    }
    if (pcVar25 == (char *)0x0) {
      pcVar25 = makesingular(local_968);
    }
    else if (cVar8 != '\0') {
      lcase(pcVar25);
    }
    txt_offset = 0;
    pcVar13 = dlb_fgets(buf,0x100,dp);
    if ((pcVar13 == (char *)0x0) || (pcVar13 = dlb_fgets(buf,0x100,dp), pcVar13 == (char *)0x0)) {
      impossible("can\'t read \'data\' file");
      goto LAB_00202d29;
    }
    iVar9 = __isoc99_sscanf(buf,"%8lx\n",&txt_offset);
    if ((0 < iVar9) && (0 < txt_offset)) {
      bVar27 = true;
      do {
        do {
          while( true ) {
            do {
              bVar26 = bVar27;
              pcVar13 = dlb_fgets(buf,0x100,dp);
              bVar20 = buf[0] == '.' || pcVar13 == (char *)0x0;
              if (bVar20) goto LAB_00201826;
              bVar7 = digit(buf[0]);
              bVar27 = bVar7 != '\0';
            } while ((bVar7 != '\0') || ((bool)(bVar26 ^ 1)));
            pcVar13 = strchr(buf,10);
            cVar2 = buf[0];
            if (pcVar13 == (char *)0x0) goto LAB_00202d0d;
            *pcVar13 = '\0';
            bVar26 = buf[0] == '~';
            bVar7 = pmatch(buf + bVar26,local_968);
            if (bVar7 == '\0') break;
            bVar27 = false;
            if (cVar2 != '~') goto LAB_00201826;
          }
          bVar27 = true;
        } while (pcVar25 == (char *)0x0);
        bVar7 = pmatch(buf + bVar26,pcVar25);
        bVar27 = bVar7 == '\0';
      } while (cVar2 == '~' || bVar7 == '\0');
      goto LAB_00201826;
    }
    goto LAB_00202d0d;
  }
  bVar20 = true;
LAB_00201826:
  init_menulist(&menu);
  uVar11 = name_to_mon(local_968);
  if ((int)uVar11 < 0) goto LAB_00202c5f;
  pm_00 = mons + uVar11;
  pcVar13 = mons_mname(pm_00);
  strcpy(mnname,pcVar13);
  lcase(mnname);
  iVar9 = strcmp(local_968,mnname);
  if (iVar9 != 0) goto LAB_00202c5f;
  pcVar13 = mons_mname(pm_00);
  local_968 = newstr;
  strcpy(local_968,pcVar13);
  iVar9 = monsndx(pm_00);
  sprintf(local_238,"Difficulty %d, AC %d, magic resistance %d.",(ulong)(uint)monstr[iVar9],
          (ulong)(uint)(int)mons[uVar11].ac);
  lVar21 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  menu.icount = menu.icount + 1;
  cVar2 = mons[uVar11].mmove;
  sprintf(buf_1,"Speed %d (",(ulong)(uint)(int)cVar2);
  if (cVar2 < 0x24) {
    if (cVar2 < '\x14') {
      if (cVar2 < '\r') {
        if (cVar2 == '\f') {
          pcVar13 = "normal speed";
        }
        else if (cVar2 < '\t') {
          if (cVar2 < '\x03') {
            pcVar13 = "sessile";
            if ('\0' < cVar2) {
              pcVar13 = "extremely slow";
            }
          }
          else {
            pcVar13 = "very slow";
          }
        }
        else {
          pcVar13 = "slow";
        }
      }
      else {
        pcVar13 = "fast";
      }
    }
    else {
      pcVar13 = "very fast";
    }
  }
  else {
    pcVar13 = "extremely fast";
  }
  strcat(buf_1,pcVar13);
  sVar14 = strlen(buf_1);
  (buf_1 + sVar14)[0] = ')';
  (buf_1 + sVar14)[1] = '.';
  buf_1[sVar14 + 2] = '\0';
  lVar21 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf_1);
  menu.icount = menu.icount + 1;
  uVar4 = mons[uVar11].geno;
  memset(buf_1,0,0x100);
  bVar3 = (byte)(uVar4 >> 8);
  if ((uVar4 >> 9 & 1) == 0) {
    builtin_strncpy(buf_1,"Normally appears ",0x12);
    iVar9 = appendc(buf_1,(uVar4 & 0xc00) == 0,"everywhere",0);
    iVar9 = appendc(buf_1,bVar3 >> 3 & 1,"outside of Gehennom",iVar9);
    bVar24 = bVar3 >> 2 & 1;
    pcVar13 = "in Gehennom";
  }
  else {
    pcVar13 = "Specially generated";
    bVar24 = 1;
    iVar9 = 0;
  }
  iVar9 = appendc(buf_1,bVar24,pcVar13,iVar9);
  iVar9 = appendc(buf_1,bVar3 >> 4 & 1,"unique",iVar9);
  if ((uVar4 & 0xc0) != 0) {
    iVar9 = appendc(buf_1,(byte)uVar4 >> 7," in groups",0);
    iVar9 = appendc(buf_1,(byte)uVar4 >> 6 & 1," in large groups",iVar9);
  }
  if ((uVar4 >> 9 & 1) != 0) goto LAB_00201e2a;
  if (iVar9 != 0) {
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = ',';
    (buf_1 + sVar14)[1] = ' ';
    buf_1[sVar14 + 2] = '\0';
  }
  switch(uVar4 & 7) {
  case 0:
    pcVar13 = eos(buf_1);
    sprintf(pcVar13," frequency %d",0);
    break;
  case 1:
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14,"very rare",10);
    break;
  case 2:
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14,"quite rare",0xb);
    break;
  case 3:
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14,"rare",5);
    break;
  case 4:
    sVar14 = strlen(buf_1);
    uVar19 = 0x6e6f6d6d6f636e75;
    goto LAB_00201dbf;
  case 5:
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14,"common",7);
    break;
  case 6:
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14,"very common",0xc);
    break;
  case 7:
    sVar14 = strlen(buf_1);
    uVar19 = 0x636966696c6f7270;
LAB_00201dbf:
    *(undefined8 *)(buf_1 + sVar14) = uVar19;
    buf_1[sVar14 + 8] = '\0';
  }
LAB_00201e2a:
  sVar14 = strlen(buf_1);
  (buf_1 + sVar14)[0] = '.';
  (buf_1 + sVar14)[1] = '\0';
  add_menutext_wrapped(&menu,(int)buf_1,text);
  bVar7 = is_unknown_dragon(pm_00);
  if (bVar7 == '\0') {
    builtin_strncpy(buf_1,"Resists ",8);
    buf_1._8_8_ = buf_1._8_8_ & 0xffffffffffffff00;
    iVar9 = mondesc_resist_flags_to_str(buf_1,mons[uVar11].mresists);
    if (iVar9 == 0) {
      lVar21 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
      }
      menu.items[menu.icount].id = 0;
      menu.items[menu.icount].role = MI_TEXT;
      menu.items[menu.icount].accel = '\0';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Has no resistanc",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0x10,"es.",4);
      menu.icount = menu.icount + 1;
    }
    else {
      sVar14 = strlen(buf_1);
      (buf_1 + sVar14)[0] = '.';
      (buf_1 + sVar14)[1] = '\0';
      add_menutext_wrapped(&menu,(int)buf_1,text_00);
    }
    if ((uVar4 & 0x10) != 0) {
      lVar21 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
      }
      menu.items[menu.icount].id = 0;
      menu.items[menu.icount].role = MI_TEXT;
      menu.items[menu.icount].accel = '\0';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Leaves no corpse",0x10);
      menu.items[menu.icount].caption[0x10] = '.';
      menu.items[menu.icount].caption[0x11] = '\0';
      goto LAB_00202119;
    }
    builtin_strncpy(buf_1,"Corpse conveys ",0x10);
    iVar9 = mondesc_resist_flags_to_str(buf_1,mons[uVar11].mconveys);
    if (iVar9 == 0) {
      lVar21 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
      }
      menu.items[menu.icount].id = 0;
      menu.items[menu.icount].role = MI_TEXT;
      menu.items[menu.icount].accel = '\0';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Corpse conveys n",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0xf,"no resistances.",0x10);
      goto LAB_00202119;
    }
    sVar14 = strlen(buf_1);
    builtin_strncpy(buf_1 + sVar14," resistance.",0xd);
    add_menutext_wrapped(&menu,(int)buf_1,text_01);
  }
  else {
    if (menu.size <= menu.icount) {
      lVar21 = (long)menu.size;
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
    }
    menu.items[menu.icount].id = 0;
    menu.items[menu.icount].role = MI_TEXT;
    menu.items[menu.icount].accel = '\0';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Resistances unkn",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0xd,"nknown.",8);
    menu.icount = menu.icount + 1;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,(long)menu.size * 0x10c);
    }
    menu.items[menu.icount].id = 0;
    menu.items[menu.icount].role = MI_TEXT;
    menu.items[menu.icount].accel = '\0';
    menu.items[menu.icount].group_accel = '\0';
    menu.items[menu.icount].selected = '\0';
    builtin_strncpy(menu.items[menu.icount].caption,"Corpse conveys u",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x10,"nknown resistanc",0x10);
    builtin_strncpy(menu.items[menu.icount].caption + 0x20,"es.",4);
LAB_00202119:
    menu.icount = menu.icount + 1;
  }
  memset(buf_1,0,0x100);
  memset(size,0,0x100);
  memset(adjbuf,0,0x100);
  memset(specialadj,0,0x100);
  memset(local_438,0,0x100);
  bVar3 = mons[uVar11].msize;
  uVar23 = (ulong)bVar3;
  uVar22 = (uint)bVar3;
  if ((uVar23 < 5) && ((0x1bU >> (uVar22 & 0x1f) & 1) != 0)) {
    pcVar13 = &DAT_002acf74 + *(int *)(&DAT_002acf74 + uVar23 * 4);
  }
  else {
    pcVar13 = "";
    if (uVar22 == 7) {
      pcVar13 = "gigantic";
    }
  }
  strcpy(size,pcVar13);
  if (size[0] == '\0') {
    if (uVar23 == 0) {
      builtin_strncpy(size,"small",6);
    }
    else if (bVar3 < 4) {
      if (uVar22 == 3) {
        builtin_strncpy(size,"big",4);
      }
    }
    else {
      size._4_2_ = size._4_2_ & 0xff00;
      builtin_strncpy(size,"huge",4);
    }
  }
  local_954 = (uint)uVar4;
  iVar9 = appendc(adjbuf,(uVar4 & 0x20) == 0,"ungenocidable",0);
  uVar22 = mons[uVar11].mflags1;
  iVar9 = appendc(adjbuf,(byte)(uVar22 >> 10) & 1,"breathless",iVar9);
  iVar9 = appendc(adjbuf,(uVar22 & 0x600) != 0,"amphibious",iVar9);
  bVar16 = (byte)uVar22;
  iVar9 = appendc(adjbuf,bVar16 >> 3 & 1,"phasing",iVar9);
  iVar9 = appendc(adjbuf,bVar16 >> 2 & 1,"amorphous",iVar9);
  bVar3 = mons[uVar11].mlet;
  uVar17 = (uint)bVar3;
  iVar9 = appendc(adjbuf,uVar17 == 0x36,"noncorporeal",iVar9);
  iVar9 = appendc(adjbuf,(byte)(uVar22 >> 0x14) & 1,"unsolid",iVar9);
  bVar24 = (byte)(uVar22 >> 0x18);
  iVar9 = appendc(adjbuf,bVar24 >> 3 & 1,"acidic",iVar9);
  bVar7 = is_unknown_dragon(pm_00);
  if (bVar7 == '\0') {
    iVar9 = appendc(adjbuf,bVar24 >> 4 & 1,"poisonous",iVar9);
  }
  iVar9 = appendc(adjbuf,(byte)(uVar22 >> 0x17) & 1,"regenerating",iVar9);
  iVar9 = appendc(adjbuf,bVar24 >> 1 & 1,"teleporting",iVar9);
  local_958 = uVar11 & 0x7ffffffd;
  bVar27 = true;
  if ((uVar11 != 0x145 && local_958 != 0x144) && ((0xfffffffd < uVar11 - 0xff || (bVar3 != 0x34))))
  {
    bVar27 = uVar17 == 0x2e;
  }
  iVar9 = appendc(adjbuf,bVar27,"reviving",iVar9);
  iVar9 = appendc(adjbuf,uVar11 == 0x7b || uVar11 == 0x9e,"invisible",iVar9);
  uVar5 = mons[uVar11].mflags2;
  bVar27 = (uVar5 & 2) == 0;
  if ((bool)(~bVar27 & 1U | uVar17 == 0x37)) {
    bVar27 = uVar17 == 0x37 && bVar27;
  }
  else {
    bVar27 = uVar11 == 0x33 || uVar17 == 0x16;
  }
  uVar12 = appendc(adjbuf,bVar27,"nonliving",iVar9);
  appendc(specialadj,(byte)uVar5 >> 1 & 1,"undead",0);
  iVar9 = appendc(local_438,(byte)(uVar22 >> 8) & 1,"hider",0);
  iVar9 = appendc(local_438,bVar16 >> 1 & 1,"swimmer",iVar9);
  iVar9 = appendc(local_438,bVar16 & 1,"flyer",iVar9);
  iVar9 = appendc(local_438,uVar17 == 5,"floater",iVar9);
  iVar9 = appendc(local_438,bVar16 >> 4 & 1,"clinger",iVar9);
  if ((uVar22 & 0x20) != 0) {
    pcVar13 = "miner";
    if ((uVar22 & 0x40) == 0) {
      pcVar13 = "digger";
    }
    appendc(local_438,'\x01',pcVar13,iVar9);
  }
  if (size[0] != '\0') {
    if ((int)uVar12 < 2) {
      if ((local_438[0] == '\0' && specialadj[0] == '\0') && (uVar12 != 0)) {
        if (uVar12 == 1) goto LAB_0020252a;
        impossible("mondesc_flags(): impossible adjnum (%d)",(ulong)uVar12);
      }
      else {
        strcat(buf_1,size);
        sVar14 = strlen(buf_1);
        (buf_1 + sVar14)[0] = ' ';
        (buf_1 + sVar14)[1] = '\0';
      }
    }
    else {
LAB_0020252a:
      strcat(buf_1,size);
      sVar14 = strlen(buf_1);
      (buf_1 + sVar14)[0] = ',';
      (buf_1 + sVar14)[1] = ' ';
      buf_1[sVar14 + 2] = '\0';
    }
  }
  if (adjbuf[0] != '\0') {
    strcat(buf_1,adjbuf);
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = ' ';
    (buf_1 + sVar14)[1] = '\0';
  }
  if (specialadj[0] != '\0') {
    strcat(buf_1,specialadj);
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = ' ';
    (buf_1 + sVar14)[1] = '\0';
  }
  if (local_438[0] != '\0') {
    strcat(buf_1,local_438);
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = ' ';
    (buf_1 + sVar14)[1] = '\0';
  }
  if (buf_1[0] != '\0') {
    upstart(buf_1);
    pcVar13 = eos(buf_1);
    pcVar13[-1] = '.';
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = ' ';
    (buf_1 + sVar14)[1] = ' ';
    buf_1[sVar14 + 2] = '\0';
  }
  iVar9 = appendp(buf_1,bVar24 & 1,"Sees invisible",0);
  iVar9 = appendp(buf_1,bVar24 >> 2 & 1,"Has teleport control",iVar9);
  iVar9 = appendp(buf_1,(uVar5 & (int)urace.selfmask) != 0,"Is the same race as you",iVar9);
  iVar9 = appendp(buf_1,uVar11 - 0xb < 2,"Petrifies by touch",iVar9);
  iVar9 = appendp(buf_1,uVar11 == 0xdb,"Disintegrates by touch",iVar9);
  if ((local_954 & 0x10) == 0) {
    pcVar13 = "May be eaten by vegans";
    if (((0x20 < uVar17) || ((0x102400404U >> ((ulong)uVar17 & 0x3f) & 1) == 0)) &&
       ((uVar11 == 0x9e || (bVar3 != 0x1f)))) {
      if ((uVar17 != 0x36) && (local_958 == 0x104 || uVar17 != 0x37)) {
        if ((uVar11 == 0xd6) || (bVar3 != 0x2a)) goto LAB_0020273e;
        pcVar13 = "May be eaten by vegetarians";
      }
    }
    iVar9 = appendp(buf_1,'\x01',pcVar13,iVar9);
  }
LAB_0020273e:
  pcVar13 = "Is not a valid polymorph form";
  if ((uVar5 & 1) == 0) {
    pcVar13 = "Is a valid polymorph form";
  }
  iVar9 = appendp(buf_1,'\x01',pcVar13,iVar9);
  bVar7 = ignores_scary(pm_00);
  appendp(buf_1,bVar7,"Ignores Elbereth engravings and dropped scare monster scrolls",iVar9);
  if (buf_1[0] != '\0') {
    sVar14 = strlen(buf_1);
    (buf_1 + sVar14)[0] = '.';
    (buf_1 + sVar14)[1] = '\0';
    add_menutext_wrapped(&menu,(int)buf_1,text_02);
  }
  memset(buf_1 + 10,0,0xf6);
  builtin_strncpy(buf_1,"Attacks:",8);
  buf_1[8] = ' ';
  buf_1[9] = '\0';
  for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
    pcVar13 = size + lVar21 * 4;
    pcVar13[0] = '\x01';
    pcVar13[1] = '\0';
    pcVar13[2] = '\0';
    pcVar13[3] = '\0';
    paVar15 = getmattk(pm_00,(int)lVar21,(int *)size,(attack *)adjbuf);
    aVar6 = *paVar15;
    mondesc_one_attack_buf = '\0';
    if ((((uint)aVar6 & 0xff0000) == 0) && (aVar6.aatyp == '\0' && (uint)aVar6 < 0x1000000)) {
      pcVar13 = "Passive";
      if (aVar6.adtyp != 0) goto LAB_0020288e;
    }
    else {
      uVar11 = (int)aVar6 + 2;
      if (((byte)uVar11 < 0x13) && ((0x7f3ffU >> (uVar11 & 0x1f) & 1) != 0)) {
        pcVar13 = &DAT_002acf88 + *(int *)(&DAT_002acf88 + (ulong)(uVar11 & 0xff) * 4);
      }
      else {
        impossible("mondesc_attack_type(): invalid attack type (%d)",(ulong)((uint)aVar6 & 0xff));
        pcVar13 = "???";
      }
LAB_0020288e:
      strcpy(&mondesc_one_attack_buf,pcVar13);
      if (0xffff < (uint)aVar6) {
        sVar14 = strlen(&mondesc_one_attack_buf);
        *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
        if (((uint)aVar6 & 0xff0000) == 0) {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x312b6c6576656c28;
          *(undefined2 *)(&DAT_003553e8 + sVar14) = 0x29;
        }
        else {
          pcVar13 = eos(&mondesc_one_attack_buf);
          sprintf(pcVar13,"%d",(ulong)((uint)aVar6 >> 0x10 & 0xff));
        }
        pcVar13 = eos(&mondesc_one_attack_buf);
        sprintf(pcVar13,"d%d",(ulong)((uint)aVar6 >> 0x18));
      }
      if ((aVar6.aatyp == '\f') && (bVar7 = is_unknown_dragon(pm_00), bVar7 != '\0')) {
        sVar14 = strlen(&mondesc_one_attack_buf);
        *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x6e776f6e6b6e7520;
        (&DAT_003553e8)[sVar14] = 0;
      }
      else {
        uVar11 = (uint)aVar6 >> 8 & 0xff;
        if (aVar6.adtyp < 0x33) {
          pcVar13 = "";
          switch(uVar11) {
          case 0:
            break;
          case 1:
            pcVar13 = "magic missile";
            break;
          case 2:
            pcVar13 = "fire";
            break;
          case 3:
            pcVar13 = "cold";
            break;
          case 4:
            pcVar13 = "sleep";
            break;
          case 5:
            pcVar13 = "disintegration";
            break;
          case 6:
            pcVar13 = "shock";
            break;
          case 7:
            pcVar13 = "poison";
            break;
          case 8:
            pcVar13 = "acid";
            break;
          case 9:
            pcVar13 = "buzz1";
            break;
          case 10:
            pcVar13 = "buzz2";
            break;
          case 0xb:
            pcVar13 = "blind";
            break;
          case 0xc:
            pcVar13 = "stun";
            break;
          case 0xd:
            pcVar13 = "slow";
            break;
          case 0xe:
            pcVar13 = "paralysis";
            break;
          case 0xf:
            pcVar13 = "drain life";
            break;
          case 0x10:
            pcVar13 = "drain energy";
            break;
          case 0x11:
            pcVar13 = "wound legs";
            break;
          case 0x12:
            pcVar13 = "petrification";
            break;
          case 0x13:
            pcVar13 = "sticky";
            break;
          case 0x14:
            pcVar13 = "steal gold";
            break;
          case 0x15:
            pcVar13 = "steal item";
            break;
          case 0x16:
            pcVar13 = "seduce (steal items)";
            break;
          case 0x17:
            pcVar13 = "teleport";
            break;
          case 0x18:
            pcVar13 = "erosion";
            break;
          case 0x19:
            pcVar13 = "confusion";
            break;
          case 0x1a:
            pcVar13 = "digest";
            break;
          case 0x1b:
            pcVar13 = "heal";
            break;
          case 0x1c:
            pcVar13 = "drowning";
            break;
          case 0x1d:
            pcVar13 = "lycanthropy";
            break;
          case 0x1e:
            pcVar13 = "poison (dexterity)";
            break;
          case 0x1f:
            pcVar13 = "poison (constitution)";
            break;
          case 0x20:
            pcVar13 = "drain intelligence";
            break;
          case 0x21:
            pcVar13 = "disease";
            break;
          case 0x22:
            pcVar13 = "decays organic items";
            break;
          case 0x23:
            pcVar13 = "seduce";
            break;
          case 0x24:
            pcVar13 = "hallucinate";
            break;
          case 0x25:
            pcVar13 = "death";
            break;
          case 0x26:
            pcVar13 = "plus disease";
            break;
          case 0x27:
            pcVar13 = "plus hunger";
            break;
          case 0x28:
            pcVar13 = "sliming";
            break;
          case 0x29:
            pcVar13 = "disenchant";
            break;
          case 0x2a:
            pcVar13 = "corrosion";
            break;
          default:
switchD_0020296c_caseD_2b:
            impossible("mondesc_damage_type(): invalid damage type (%d)",
                       (ulong)((uint)aVar6 >> 8 & 0xff));
            pcVar13 = "???";
            break;
          case 0x32:
            pcVar13 = "beheading";
            break;
          case 0x33:
            halt_baddata();
          }
        }
        else if (uVar11 == 0xf0) {
          pcVar13 = "(clerical)";
        }
        else {
          pcVar13 = "";
          if (uVar11 != 0xf1) {
            if (uVar11 == 0xf2) {
              pcVar13 = "random";
            }
            else if (uVar11 == 0xfc) {
              pcVar13 = "artifact stealing";
            }
            else {
              if (uVar11 != 0xfd) goto switchD_0020296c_caseD_2b;
              pcVar13 = "steal intrinsic";
            }
          }
        }
        if (*pcVar13 != '\0') {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
          strcat(&mondesc_one_attack_buf,pcVar13);
        }
      }
    }
    if (mondesc_one_attack_buf == '\0') {
      if (lVar21 == 0) {
        sVar14 = strlen(buf_1);
        builtin_strncpy(buf_1 + sVar14,"none",5);
      }
      break;
    }
    if (lVar21 != 0) {
      sVar14 = strlen(buf_1);
      (buf_1 + sVar14)[0] = ',';
      (buf_1 + sVar14)[1] = ' ';
      buf_1[sVar14 + 2] = '\0';
    }
    strcat(buf_1,&mondesc_one_attack_buf);
  }
  sVar14 = strlen(buf_1);
  (buf_1 + sVar14)[0] = '.';
  (buf_1 + sVar14)[1] = '\0';
  add_menutext_wrapped(&menu,(int)buf_1,text_03);
LAB_00202c5f:
  if (bVar20) {
    if ((cVar8 != '\0') && (menu.icount == 0)) {
      pline("I don\'t have any information on those things.");
    }
LAB_00202c84:
    iVar9 = menu.icount;
    pnVar1 = menu.items;
    if (menu.icount != 0) {
      pcVar13 = upstart(local_968);
      display_menu(pnVar1,iVar9,pcVar13,0,(int *)0x0);
    }
  }
  else {
    do {
      pcVar13 = dlb_fgets(buf,0x100,dp);
      if (pcVar13 == (char *)0x0) goto LAB_00202d0d;
      bVar7 = digit(buf[0]);
    } while (bVar7 == '\0');
    iVar9 = __isoc99_sscanf(buf,"%ld,%d\n",&entry_offset);
    if (1 < iVar9) {
      if (((char)local_950 != '\0' || cVar8 != '\0') ||
         (cVar8 = yn_function("More info?","yn",'n'), cVar8 == 'y')) {
        iVar9 = dlb_fseek(dp,entry_offset + txt_offset,0);
        if (iVar9 < 0) {
          pline("? Seek error on \'data\' file!");
          free(menu.items);
          goto LAB_00202d29;
        }
        if (menu.icount != 0) {
          lVar21 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
          }
          lVar21 = (long)menu.icount;
          menu.items[lVar21].accel = '\0';
          menu.items[lVar21].group_accel = '\0';
          menu.items[lVar21].selected = '\0';
          menu.items[lVar21].id = 0;
          menu.items[lVar21].role = MI_TEXT;
          menu.items[lVar21].caption[0] = '\0';
          menu.icount = menu.icount + 1;
        }
        pcVar13 = buf + 1;
        for (iVar9 = 0; iVar9 < entry_count; iVar9 = iVar9 + 1) {
          pcVar25 = dlb_fgets(buf,0x100,dp);
          if (pcVar25 == (char *)0x0) goto LAB_00202d0d;
          pcVar25 = strchr(buf,10);
          if (pcVar25 != (char *)0x0) {
            *pcVar25 = '\0';
          }
          pcVar25 = strchr(pcVar13,9);
          if (pcVar25 != (char *)0x0) {
            tabexpand(pcVar13);
          }
          lVar21 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
          }
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,pcVar13);
          menu.icount = menu.icount + 1;
        }
      }
      goto LAB_00202c84;
    }
LAB_00202d0d:
    impossible("\'data\' file in wrong format");
  }
  free(menu.items);
LAB_00202d29:
  dlb_fclose(dp);
  return;
}

Assistant:

static void checkfile(const char *inp, struct permonst *pm, boolean user_typed_name,
		      boolean without_asking)
{
    dlb *fp;
    char buf[BUFSZ], newstr[BUFSZ];
    char *ep, *dbase_str;
    long txt_offset;
    int chk_skip;
    boolean found_in_file = FALSE, skipping_entry = FALSE;
    int mntmp;
    char mnname[BUFSZ];
    struct menulist menu;

    fp = dlb_fopen(DATAFILE, "r");
    if (!fp) {
	pline("Cannot open data file!");
	return;
    }

    if (user_typed_name)
	pline("Looking up \"%s\"...", inp);

    /* To prevent the need for entries in data.base like *ngel to account
     * for Angel and angel, make the lookup string the same for both
     * user_typed_name and picked name.
     */
    if (pm != NULL && !user_typed_name)
	dbase_str = strcpy(newstr, mons_mname(pm));
    else dbase_str = strcpy(newstr, inp);
    lcase(dbase_str);

    if (!strncmp(dbase_str, "interior of ", 12))
	dbase_str += 12;
    if (!strncmp(dbase_str, "a ", 2))
	dbase_str += 2;
    else if (!strncmp(dbase_str, "an ", 3))
	dbase_str += 3;
    else if (!strncmp(dbase_str, "the ", 4))
	dbase_str += 4;
    if (!strncmp(dbase_str, "tame ", 5))
	dbase_str += 5;
    else if (!strncmp(dbase_str, "peaceful ", 9))
	dbase_str += 9;
    if (!strncmp(dbase_str, "invisible ", 10))
	dbase_str += 10;
    if (!strncmp(dbase_str, "statue of ", 10))
	dbase_str[6] = '\0';
    else if (!strncmp(dbase_str, "figurine of ", 12))
	dbase_str[8] = '\0';

    /* Make sure the name is non-empty. */
    if (*dbase_str) {
	/* adjust the input to remove " [seen" and "named " and convert to lower case */
	char *alt = 0;	/* alternate description */

	if ((ep = strstri(dbase_str, " [seen")) != 0 ||
	    (ep = strstri(dbase_str, " and more")) != 0)
	    *ep = '\0';

	if ((ep = strstri(dbase_str, " named ")) != 0)
	    alt = ep + 7;
	else
	    ep = strstri(dbase_str, " called ");
	if (!ep) ep = strstri(dbase_str, ", ");
	if (ep && ep > dbase_str) *ep = '\0';

	/*
	 * If the object is named, then the name is the alternate description;
	 * otherwise, the result of makesingular() applied to the name is. This
	 * isn't strictly optimal, but named objects of interest to the user
	 * will usually be found under their name, rather than under their
	 * object type, so looking for a singular form is pointless.
	 */

	if (!alt)
	    alt = makesingular(dbase_str);
	else
	    if (user_typed_name)
		lcase(alt);

	/* skip first record; read second */
	txt_offset = 0L;
	if (!dlb_fgets(buf, BUFSZ, fp) || !dlb_fgets(buf, BUFSZ, fp)) {
	    impossible("can't read 'data' file");
	    dlb_fclose(fp);
	    return;
	} else if (sscanf(buf, "%8lx\n", &txt_offset) < 1 || txt_offset <= 0)
	    goto bad_data_file;

	/* look for the appropriate entry */
	while (dlb_fgets(buf,BUFSZ,fp)) {
	    if (*buf == '.') break;  /* we passed last entry without success */

	    if (digit(*buf)) {
		/* a number indicates the end of current entry */
		skipping_entry = FALSE;
	    } else if (!skipping_entry) {
		if (!(ep = strchr(buf, '\n'))) goto bad_data_file;
		*ep = 0;
		/* if we match a key that begins with "~", skip this entry */
		chk_skip = (*buf == '~') ? 1 : 0;
		if (pmatch(&buf[chk_skip], dbase_str) ||
			(alt && pmatch(&buf[chk_skip], alt))) {
		    if (chk_skip) {
			skipping_entry = TRUE;
			continue;
		    } else {
			found_in_file = TRUE;
			break;
		    }
		}
	    }
	}
    }

    init_menulist(&menu);

    mntmp = name_to_mon(dbase_str);
    if (mntmp >= LOW_PM) {
	strcpy(mnname, mons_mname(&mons[mntmp]));
	lcase(mnname);
	if (!strcmp(dbase_str, mnname)) {
	    dbase_str = strcpy(newstr, mons_mname(&mons[mntmp]));
	    mondesc_all(&menu, &mons[mntmp]);
	}
    }

    if (found_in_file) {
	long entry_offset;
	int  entry_count;
	int  i;

	/* skip over other possible matches for the info */
	do {
	    if (!dlb_fgets(buf, BUFSZ, fp))
		goto bad_data_file;
	} while (!digit(*buf));
	
	if (sscanf(buf, "%ld,%d\n", &entry_offset, &entry_count) < 2) {
bad_data_file:	impossible("'data' file in wrong format");
		free(menu.items);
		dlb_fclose(fp);
		return;
	}

	if (user_typed_name || without_asking || yn("More info?") == 'y') {

	    if (dlb_fseek(fp, txt_offset + entry_offset, SEEK_SET) < 0) {
		pline("? Seek error on 'data' file!");
		free(menu.items);
		dlb_fclose(fp);
		return;
	    }

	    if (menu.icount)
		add_menutext(&menu, "");

	    for (i = 0; i < entry_count; i++) {
		if (!dlb_fgets(buf, BUFSZ, fp))
		    goto bad_data_file;
		if ((ep = strchr(buf, '\n')) != 0)
		    *ep = 0;
		if (strchr(buf+1, '\t') != 0)
		    tabexpand(buf+1);
		add_menutext(&menu, buf+1);
	    }
	}
    } else if (user_typed_name && !menu.icount) {
	pline("I don't have any information on those things.");
    }

    if (menu.icount)
	display_menu(menu.items, menu.icount, upstart(dbase_str), FALSE, NULL);
    free(menu.items);

    dlb_fclose(fp);
}